

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O2

int ndiGetBX2Transform(ndicapi *pol,int portHandle,float *transform)

{
  uint uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  float *pfVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  
  uVar1 = pol->Bx2HandleCount;
  uVar6 = 0;
  uVar8 = 0;
  if (0 < (int)uVar1) {
    uVar8 = (ulong)uVar1;
  }
  do {
    if (uVar8 == uVar6) {
LAB_00108d85:
      uVar7 = 1;
      if ((uint)uVar8 != uVar1) {
        uVar2 = *(undefined8 *)pol->Bx2Transforms[uVar8];
        uVar3 = *(undefined8 *)(pol->Bx2Transforms[uVar8] + 2);
        pfVar5 = pol->Bx2Transforms[uVar8];
        uVar4 = *(undefined8 *)(pfVar5 + 6);
        *(undefined8 *)(transform + 4) = *(undefined8 *)(pfVar5 + 4);
        *(undefined8 *)(transform + 6) = uVar4;
        *(undefined8 *)transform = uVar2;
        *(undefined8 *)(transform + 2) = uVar3;
        if ((pol->Bx2HandlesStatus[uVar8] & 4) == 0) {
          uVar7 = pol->Bx2HandlesStatus[uVar8] >> 7 & 2;
        }
      }
      return uVar7;
    }
    if ((uint)pol->Bx2Handles[uVar6] == portHandle) {
      uVar8 = uVar6 & 0xffffffff;
      goto LAB_00108d85;
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

ndicapiExport int ndiGetBX2Transform(ndicapi* pol, int portHandle, float transform[8])
{
  int i, n;

  n = pol->Bx2HandleCount;
  for (i = 0; i < n; i++)
  {
    if (pol->Bx2Handles[i] == portHandle)
    {
      break;
    }
  }
  if (i == n)
  {
    return NDI_DISABLED;
  }

  memcpy(&transform[0], &pol->Bx2Transforms[i][0], sizeof(float) * 8);
  if (pol->Bx2HandlesStatus[i] & NDI_HANDLE_DISABLED)
  {
    return NDI_DISABLED;
  }
  else if (pol->Bx2HandlesStatus[i] & NDI_BX2_MISSING_BIT)
  {
    return NDI_MISSING;
  }

  return NDI_OKAY;
}